

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O3

bool __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::negativeHasMinusSign
          (PropertiesAffixPatternProvider *this)

{
  bool bVar1;
  bool bVar2;
  ErrorCode localStatus;
  ErrorCode local_28;
  
  local_28._vptr_ErrorCode = (_func_int **)&PTR__ErrorCode_003d95f8;
  local_28.errorCode = U_ZERO_ERROR;
  bVar1 = AffixUtils::containsType(&this->negPrefix,TYPE_MINUS_SIGN,&local_28.errorCode);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = AffixUtils::containsType(&this->negSuffix,TYPE_MINUS_SIGN,&local_28.errorCode);
  }
  ErrorCode::~ErrorCode(&local_28);
  return bVar2;
}

Assistant:

bool PropertiesAffixPatternProvider::negativeHasMinusSign() const {
    ErrorCode localStatus;
    return AffixUtils::containsType(negPrefix, TYPE_MINUS_SIGN, localStatus) ||
           AffixUtils::containsType(negSuffix, TYPE_MINUS_SIGN, localStatus);
}